

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorLinear.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMotorLinear::SetGuideConstraint(ChLinkMotorLinear *this,GuideConstraint mconstraint)

{
  if (mconstraint == SPHERICAL) {
    (this->super_ChLinkMotor).super_ChLinkMateGeneric.c_y = true;
    (this->super_ChLinkMotor).super_ChLinkMateGeneric.c_z = true;
    (this->super_ChLinkMotor).super_ChLinkMateGeneric.c_rx = false;
    (this->super_ChLinkMotor).super_ChLinkMateGeneric.c_ry = false;
  }
  else {
    if (mconstraint == PRISMATIC) {
      (this->super_ChLinkMotor).super_ChLinkMateGeneric.c_rz = true;
      (this->super_ChLinkMotor).super_ChLinkMateGeneric.c_y = true;
      (this->super_ChLinkMotor).super_ChLinkMateGeneric.c_z = true;
      (this->super_ChLinkMotor).super_ChLinkMateGeneric.c_rx = true;
      (this->super_ChLinkMotor).super_ChLinkMateGeneric.c_ry = true;
      ChLinkMateGeneric::SetupLinkMask((ChLinkMateGeneric *)this);
      return;
    }
    if (mconstraint != FREE) {
      return;
    }
    (this->super_ChLinkMotor).super_ChLinkMateGeneric.c_y = false;
    (this->super_ChLinkMotor).super_ChLinkMateGeneric.c_z = false;
    (this->super_ChLinkMotor).super_ChLinkMateGeneric.c_rx = false;
    (this->super_ChLinkMotor).super_ChLinkMateGeneric.c_ry = false;
  }
  (this->super_ChLinkMotor).super_ChLinkMateGeneric.c_rz = false;
  ChLinkMateGeneric::SetupLinkMask((ChLinkMateGeneric *)this);
  return;
}

Assistant:

void ChLinkMotorLinear::SetGuideConstraint(const GuideConstraint mconstraint) {
    if (mconstraint == GuideConstraint::FREE) {
        this->c_y = false;
        this->c_z = false;
        this->c_rx = false;
        this->c_ry = false;
        this->c_rz = false;
        SetupLinkMask();
    }
    if (mconstraint == GuideConstraint::PRISMATIC) {
        this->c_y = true;
        this->c_z = true;
        this->c_rx = true;
        this->c_ry = true;
        this->c_rz = true;
        SetupLinkMask();
    }
    if (mconstraint == GuideConstraint::SPHERICAL) {
        this->c_y = true;
        this->c_z = true;
        this->c_rx = false;
        this->c_ry = false;
        this->c_rz = false;
        SetupLinkMask();
    }
}